

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonahanPlanner.cpp
# Opt level: O2

void __thiscall
MonahanPlanner::CheckMaxNrVectors(MonahanPlanner *this,size_t maxNrAlphas,size_t nrAlphas)

{
  ostream *poVar1;
  E *this_00;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  if (nrAlphas <= maxNrAlphas || maxNrAlphas == 0) {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_190,"MonahanPlanner::CheckMaxNrVectors too many alpha vectors ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,">");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  this_00 = (E *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  E::E(this_00,&local_1c0);
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void MonahanPlanner::CheckMaxNrVectors(size_t maxNrAlphas, size_t nrAlphas) const
{
    if(maxNrAlphas && nrAlphas>maxNrAlphas)
    {
        stringstream ss;
        ss << "MonahanPlanner::CheckMaxNrVectors too many alpha vectors "
           << nrAlphas << ">" << maxNrAlphas;
        throw(E(ss.str()));
    }
}